

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altsvc.c
# Opt level: O0

CURLcode altsvc_out(altsvc *as,FILE *fp)

{
  ushort uVar1;
  char *pcVar2;
  char *whereto;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  undefined1 local_b8 [8];
  char ipv6_unused [16];
  char *pcStack_a0;
  CURLcode result;
  char *src6_post;
  char *src6_pre;
  char *dst6_post;
  char *dst6_pre;
  tm stamp;
  FILE *fp_local;
  altsvc *as_local;
  
  dst6_post = "";
  src6_pre = "";
  src6_post = "";
  pcStack_a0 = "";
  stamp.tm_zone = (char *)fp;
  ipv6_unused._12_4_ = Curl_gmtime(as->expires,(tm *)&dst6_pre);
  as_local._4_4_ = ipv6_unused._12_4_;
  if (ipv6_unused._12_4_ == CURLE_OK) {
    iVar3 = inet_pton(10,(as->dst).host,local_b8);
    if (iVar3 == 1) {
      dst6_post = "[";
      src6_pre = "]";
    }
    iVar3 = inet_pton(10,(as->src).host,local_b8);
    whereto = stamp.tm_zone;
    if (iVar3 == 1) {
      src6_post = "[";
      pcStack_a0 = "]";
    }
    pcVar4 = Curl_alpnid2str((as->src).alpnid);
    pcVar2 = (as->src).host;
    uVar1 = (as->src).port;
    pcVar5 = Curl_alpnid2str((as->dst).alpnid);
    curl_mfprintf((FILE *)whereto,"%s %s%s%s %u %s %s%s%s %u \"%d%02d%02d %02d:%02d:%02d\" %u %u\n",
                  pcVar4,src6_post,pcVar2,pcStack_a0,(uint)uVar1,pcVar5,dst6_post,(as->dst).host,
                  src6_pre,(uint)(as->dst).port,stamp.tm_mday + 0x76c,stamp.tm_hour + 1,stamp.tm_min
                  ,stamp.tm_sec,dst6_pre._4_4_,dst6_pre._0_4_,(uint)(as->field_0x4c & 1),as->prio);
    as_local._4_4_ = CURLE_OK;
  }
  return as_local._4_4_;
}

Assistant:

static CURLcode altsvc_out(struct altsvc *as, FILE *fp)
{
  struct tm stamp;
  const char *dst6_pre = "";
  const char *dst6_post = "";
  const char *src6_pre = "";
  const char *src6_post = "";
  CURLcode result = Curl_gmtime(as->expires, &stamp);
  if(result)
    return result;
#ifdef USE_IPV6
  else {
    char ipv6_unused[16];
    if(1 == curlx_inet_pton(AF_INET6, as->dst.host, ipv6_unused)) {
      dst6_pre = "[";
      dst6_post = "]";
    }
    if(1 == curlx_inet_pton(AF_INET6, as->src.host, ipv6_unused)) {
      src6_pre = "[";
      src6_post = "]";
    }
  }
#endif
  fprintf(fp,
          "%s %s%s%s %u "
          "%s %s%s%s %u "
          "\"%d%02d%02d "
          "%02d:%02d:%02d\" "
          "%u %u\n",
          Curl_alpnid2str(as->src.alpnid),
          src6_pre, as->src.host, src6_post,
          as->src.port,

          Curl_alpnid2str(as->dst.alpnid),
          dst6_pre, as->dst.host, dst6_post,
          as->dst.port,

          stamp.tm_year + 1900, stamp.tm_mon + 1, stamp.tm_mday,
          stamp.tm_hour, stamp.tm_min, stamp.tm_sec,
          as->persist, as->prio);
  return CURLE_OK;
}